

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setMask(QWidget *this,QRegion *newMask)

{
  undefined4 uVar1;
  QWidgetPrivate *this_00;
  QWExtra *pQVar2;
  QWidgetData *pQVar3;
  char cVar4;
  byte bVar5;
  long in_FS_OFFSET;
  QRegion expose;
  QRegion oldMask;
  QRect local_50;
  QRegion local_40;
  QRegion local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createExtra(this_00);
  cVar4 = QRegion::operator==(newMask,&((this_00->extra)._M_t.
                                        super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>
                                        .super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->mask
                             );
  if (cVar4 != '\0') goto LAB_0030f8cd;
  local_38.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion(&local_38,
                   &((this_00->extra)._M_t.
                     super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                     super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->mask);
  QRegion::operator=(&((this_00->extra)._M_t.
                       super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                       super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->mask,newMask);
  bVar5 = QRegion::isEmpty();
  pQVar2 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  *(ushort *)&pQVar2->field_0x7c =
       (ushort)*(undefined4 *)&pQVar2->field_0x7c & 0xff7f | (ushort)(bVar5 ^ 1) << 7;
  if ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) != 0) {
    QWidgetPrivate::setMask_sys(this_00,newMask);
    pQVar3 = this->data;
    if ((pQVar3->widget_attributes & 0x8000) != 0) {
      if ((((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
            .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
            super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c & 0x80) == 0) {
        local_40.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        local_50.x2.m_i = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
        local_50.y2.m_i = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
        local_50.x1.m_i = 0;
        local_50.y1.m_i = 0;
        QRegion::QRegion(&local_40,&local_50,Rectangle);
        QRegion::operator-=(&local_40,&local_38);
        cVar4 = QRegion::isEmpty();
        if (cVar4 == '\0') {
          QWidgetPrivate::setDirtyOpaqueRegion(this_00);
          update(this,&local_40);
        }
      }
      else {
        if (((pQVar3->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) goto LAB_0030f8c3;
        local_40.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        local_50.x2.m_i = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
        local_50.y2.m_i = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
        local_50.x1.m_i = 0;
        local_50.y1.m_i = 0;
        QRegion::QRegion(&local_40,&local_50,Rectangle);
        QRegion::operator-=(&local_40,newMask);
        cVar4 = QRegion::isEmpty();
        if (cVar4 == '\0') {
          QWidgetPrivate::setDirtyOpaqueRegion(this_00);
          uVar1 = (this->data->crect).x1;
          QRegion::translate((int)&local_40,uVar1);
          update(*(QWidget **)(*(long *)&this->field_0x8 + 0x10),&local_40);
        }
        cVar4 = QRegion::isEmpty();
        if (cVar4 == '\0') {
          QRegion::operator-((QRegion *)&local_50,newMask);
          update(this,(QRegion *)&local_50);
          QRegion::~QRegion((QRegion *)&local_50);
        }
      }
      QRegion::~QRegion(&local_40);
    }
  }
LAB_0030f8c3:
  QRegion::~QRegion(&local_38);
LAB_0030f8cd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setMask(const QRegion &newMask)
{
    Q_D(QWidget);

    d->createExtra();
    if (newMask == d->extra->mask)
        return;

#ifndef QT_NO_BACKINGSTORE
    const QRegion oldMask(d->extra->mask);
#endif

    d->extra->mask = newMask;
    d->extra->hasMask = !newMask.isEmpty();

    if (!testAttribute(Qt::WA_WState_Created))
        return;

    d->setMask_sys(newMask);

#ifndef QT_NO_BACKINGSTORE
    if (!isVisible())
        return;

    if (!d->extra->hasMask) {
        // Mask was cleared; update newly exposed area.
        QRegion expose(rect());
        expose -= oldMask;
        if (!expose.isEmpty()) {
            d->setDirtyOpaqueRegion();
            update(expose);
        }
        return;
    }

    if (!isWindow()) {
        // Update newly exposed area on the parent widget.
        QRegion parentExpose(rect());
        parentExpose -= newMask;
        if (!parentExpose.isEmpty()) {
            d->setDirtyOpaqueRegion();
            parentExpose.translate(data->crect.topLeft());
            parentWidget()->update(parentExpose);
        }

        // Update newly exposed area on this widget
        if (!oldMask.isEmpty())
            update(newMask - oldMask);
    }
#endif
}